

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void lws_vhost_destroy(lws_vhost *vh)

{
  lws_deferred_free *ptr;
  unsigned_long uVar1;
  
  ptr = (lws_deferred_free *)lws_realloc((void *)0x0,0x18,"deferred free");
  if (ptr != (lws_deferred_free *)0x0) {
    lws_vhost_destroy1(vh);
    _lws_log(0x10,"%s: count_bound_wsi %d\n","lws_vhost_destroy",(ulong)(uint)vh->count_bound_wsi);
    if (vh->count_bound_wsi == 0) {
      __lws_vhost_destroy2(vh);
      lws_realloc(ptr,0,"lws_free");
      return;
    }
    ptr->next = vh->context->deferred_free_list;
    uVar1 = lws_now_secs();
    ptr->deadline = uVar1;
    ptr->payload = vh;
    vh->context->deferred_free_list = ptr;
  }
  return;
}

Assistant:

void
lws_vhost_destroy(struct lws_vhost *vh)
{
	struct lws_deferred_free *df = lws_malloc(sizeof(*df), "deferred free");
	struct lws_context *context = vh->context;

	if (!df)
		return;

	lws_context_lock(context, __func__); /* ------ context { */

	lws_vhost_destroy1(vh);

	lwsl_debug("%s: count_bound_wsi %d\n", __func__, vh->count_bound_wsi);

	if (!vh->count_bound_wsi) {
		/*
		 * After listen handoff, there are already no wsi bound to this
		 * vhost by any pt: nothing can be servicing any wsi belonging
		 * to it any more.
		 *
		 * Finalize the vh destruction immediately
		 */
		__lws_vhost_destroy2(vh);
		lws_free(df);

		goto out;
	}

	/* part 2 is deferred to allow all the handle closes to complete */

	df->next = vh->context->deferred_free_list;
	df->deadline = lws_now_secs();
	df->payload = vh;
	vh->context->deferred_free_list = df;

out:
	lws_context_unlock(context); /* } context ------------------- */
}